

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chnsecal.cpp
# Opt level: O3

double __thiscall icu_63::ChineseCalendar::millisToDays(ChineseCalendar *this,double millis)

{
  TimeZone *pTVar1;
  double dVar2;
  int32_t dstOffset;
  int32_t rawOffset;
  UErrorCode status;
  int local_20;
  int local_1c;
  double local_18;
  int local_c;
  
  pTVar1 = this->fZoneAstroCalc;
  if (pTVar1 != (TimeZone *)0x0) {
    local_c = 0;
    local_18 = millis;
    (*(pTVar1->super_UObject)._vptr_UObject[6])(pTVar1,0,&local_1c,&local_20,&local_c);
    millis = local_18;
    if (local_c < 1) {
      dVar2 = (double)(local_20 + local_1c) + local_18;
      goto LAB_001ec465;
    }
  }
  dVar2 = millis + 28800000.0;
LAB_001ec465:
  dVar2 = uprv_floor_63(dVar2 / 86400000.0);
  return dVar2;
}

Assistant:

double ChineseCalendar::millisToDays(double millis) const {
    if (fZoneAstroCalc != NULL) {
        int32_t rawOffset, dstOffset;
        UErrorCode status = U_ZERO_ERROR;
        fZoneAstroCalc->getOffset(millis, FALSE, rawOffset, dstOffset, status);
        if (U_SUCCESS(status)) {
        	return ClockMath::floorDivide(millis + (double)(rawOffset + dstOffset), kOneDay);
        }
    }
    return ClockMath::floorDivide(millis + (double)CHINA_OFFSET, kOneDay);
}